

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

void Assimp::FBX::ParseVectorDataArray(vector<long,_std::allocator<long>_> *out,Element *el)

{
  Token *t;
  pointer ppTVar1;
  char *end;
  pointer pcVar2;
  size_t __n;
  Scope *sc;
  Element *pEVar3;
  Element *in_R9;
  pointer ppTVar4;
  long lVar5;
  char type;
  char *data;
  vector<char,_std::allocator<char>_> buff;
  int64_t val;
  uint32_t count;
  
  std::vector<long,_std::allocator<long>_>::resize(out,0);
  ppTVar4 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar4 ==
      (el->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buff,"unexpected empty element",(allocator<char> *)&data);
    anon_unknown.dwarf_e3fe61::ParseError((string *)&buff,el);
  }
  t = *ppTVar4;
  if (t->column == 0xffffffff) {
    data = t->sbegin;
    end = t->send;
    anon_unknown_20::ReadBinaryDataArrayHead(&data,end,&type,&count,el);
    if ((ulong)count != 0) {
      if (type != 'l') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buff,"expected long array (binary)",(allocator<char> *)&val);
        anon_unknown.dwarf_e3fe61::ParseError((string *)&buff,el);
      }
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      anon_unknown_20::ReadBinaryDataArray('l',count,&data,end,&buff,in_R9);
      std::vector<long,_std::allocator<long>_>::reserve(out,(ulong)count);
      pcVar2 = buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (lVar5 = 0; count != (uint32_t)lVar5; lVar5 = lVar5 + 1) {
        val = *(int64_t *)(pcVar2 + lVar5 * 8);
        std::vector<long,_std::allocator<long>_>::push_back(out,&val);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&buff.super__Vector_base<char,_std::allocator<char>_>);
    }
  }
  else {
    __n = ParseTokenAsDim(t);
    std::vector<long,_std::allocator<long>_>::reserve(out,__n);
    sc = GetRequiredScope(el);
    std::__cxx11::string::string<std::allocator<char>>((string *)&buff,"a",(allocator<char> *)&data)
    ;
    pEVar3 = GetRequiredElement(sc,(string *)&buff,el);
    std::__cxx11::string::~string((string *)&buff);
    ppTVar1 = (pEVar3->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar4 = (pEVar3->tokens).
                   super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppTVar4 != ppTVar1;
        ppTVar4 = ppTVar4 + 1) {
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)ParseTokenAsInt64(*ppTVar4);
      std::vector<long,_std::allocator<long>_>::push_back(out,(value_type_conflict8 *)&buff);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<int64_t>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if (tok.empty()) {
        ParseError("unexpected empty element", &el);
    }

    if (tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if (!count) {
            return;
        }

        if (type != 'l') {
            ParseError("expected long array (binary)", &el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * 8);

        out.reserve(count);

        const int64_t* ip = reinterpret_cast<const int64_t*>(&buff[0]);
        for (unsigned int i = 0; i < count; ++i, ++ip) {
            BE_NCONST int64_t val = *ip;
            AI_SWAP8(val);
            out.push_back(val);
        }

        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    // see notes in ParseVectorDataArray()
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope, "a", &el);

    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end;) {
        const int64_t ival = ParseTokenAsInt64(**it++);

        out.push_back(ival);
    }
}